

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SymbolTable.cpp
# Opt level: O2

void __thiscall glslang::TVariable::TVariable(TVariable *this,TVariable *copyOf)

{
  TConstUnionVector *pTVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  undefined4 extraout_var;
  TTypeList *pTVar5;
  undefined4 extraout_var_00;
  int m;
  TConstUnionArray newArray;
  
  TSymbol::TSymbol(&this->super_TSymbol,&copyOf->super_TSymbol);
  (this->super_TSymbol)._vptr_TSymbol = (_func_int **)&PTR_clone_0089a900;
  TType::TType(&this->type,EbtVoid,EvqTemporary,1,0,0,false);
  (this->constArray)._vptr_TConstUnionArray = (_func_int **)&PTR__TConstUnionArray_0089abb8;
  (this->constArray).unionArray = (TConstUnionVector *)0x0;
  TType::deepCopy(&this->type,&copyOf->type);
  this->userType = copyOf->userType;
  (this->super_TSymbol).extensions = (TExtensionList *)0x0;
  this->constSubtree = (TIntermTyped *)0x0;
  this->memberExtensions = (TVector<glslang::TVector<const_char_*>_> *)0x0;
  iVar2 = (*(copyOf->super_TSymbol)._vptr_TSymbol[0x11])(copyOf);
  if (0 < iVar2) {
    uVar3 = (*(copyOf->super_TSymbol)._vptr_TSymbol[0x11])(copyOf);
    iVar2 = (*(copyOf->super_TSymbol)._vptr_TSymbol[0x12])(copyOf);
    (*(this->super_TSymbol)._vptr_TSymbol[0x10])(this,(ulong)uVar3,CONCAT44(extraout_var,iVar2));
  }
  iVar2 = (*(copyOf->super_TSymbol)._vptr_TSymbol[0x1f])(copyOf);
  if ((char)iVar2 != '\0') {
    uVar3 = 0;
    while( true ) {
      pTVar5 = TType::getStruct(&copyOf->type);
      if ((int)((ulong)((long)(pTVar5->
                              super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                              ).
                              super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(pTVar5->
                             super_vector<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                             ).
                             super__Vector_base<glslang::TTypeLoc,_glslang::pool_allocator<glslang::TTypeLoc>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 5) <= (int)uVar3) break;
      iVar2 = (*(copyOf->super_TSymbol)._vptr_TSymbol[0x20])(copyOf,(ulong)uVar3);
      if (0 < iVar2) {
        uVar4 = (*(copyOf->super_TSymbol)._vptr_TSymbol[0x20])(copyOf,(ulong)uVar3);
        iVar2 = (*(copyOf->super_TSymbol)._vptr_TSymbol[0x21])(copyOf,(ulong)uVar3);
        (*(this->super_TSymbol)._vptr_TSymbol[0x1e])
                  (this,(ulong)uVar3,(ulong)uVar4,CONCAT44(extraout_var_00,iVar2));
      }
      uVar3 = uVar3 + 1;
    }
  }
  pTVar1 = (copyOf->constArray).unionArray;
  if (pTVar1 != (TConstUnionVector *)0x0) {
    if ((byte)(copyOf->type).field_0x8 - 0xf < 2) {
      __assert_fail("! copyOf.type.isStruct()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/SymbolTable.cpp"
                    ,0x189,"glslang::TVariable::TVariable(const TVariable &)");
    }
    TConstUnionArray::TConstUnionArray
              (&newArray,&copyOf->constArray,0,
               (int)((ulong)((long)(pTVar1->
                                   super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                   ).
                                   super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pTVar1->
                                  super_vector<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                  ).
                                  super__Vector_base<glslang::TConstUnion,_glslang::pool_allocator<glslang::TConstUnion>_>
                                  ._M_impl.super__Vector_impl_data._M_start) >> 4));
    (this->constArray).unionArray = newArray.unionArray;
  }
  return;
}

Assistant:

TVariable::TVariable(const TVariable& copyOf) : TSymbol(copyOf)
{
    type.deepCopy(copyOf.type);
    userType = copyOf.userType;

    // we don't support specialization-constant subtrees in cloned tables, only extensions
    constSubtree = nullptr;
    extensions = nullptr;
    memberExtensions = nullptr;
    if (copyOf.getNumExtensions() > 0)
        setExtensions(copyOf.getNumExtensions(), copyOf.getExtensions());
    if (copyOf.hasMemberExtensions()) {
        for (int m = 0; m < (int)copyOf.type.getStruct()->size(); ++m) {
            if (copyOf.getNumMemberExtensions(m) > 0)
                setMemberExtensions(m, copyOf.getNumMemberExtensions(m), copyOf.getMemberExtensions(m));
        }
    }

    if (! copyOf.constArray.empty()) {
        assert(! copyOf.type.isStruct());
        TConstUnionArray newArray(copyOf.constArray, 0, copyOf.constArray.size());
        constArray = newArray;
    }
}